

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::InnerMap::iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_unsigned_long>
* __thiscall
google::protobuf::Map<std::__cxx11::string,std::__cxx11::string>::InnerMap::
FindHelper<std::__cxx11::string>
          (pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::InnerMap::iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_unsigned_long>
           *__return_storage_ptr__,InnerMap *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k,TreeIterator *it)

{
  bool bVar1;
  LogMessage *other;
  const_iterator local_e8;
  _Base_ptr local_d0;
  iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  _Self local_b0;
  _Self local_a8;
  iterator tree_it;
  Tree *tree;
  byte local_81;
  LogMessage local_80;
  iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  Node *local_30;
  Node *node;
  size_type b;
  TreeIterator *it_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k_local;
  InnerMap *this_local;
  
  b = (size_type)it;
  it_local = (TreeIterator *)k;
  k_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  node = (Node *)BucketNumber<std::__cxx11::string>(this,k);
  bVar1 = Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::InnerMap::TableEntryIsNonEmptyList((InnerMap *)this,(size_type)node);
  if (bVar1) {
    local_30 = *(Node **)(*(long *)(this + 0x20) + (long)node * 8);
    do {
      bVar1 = internal::TransparentSupport<std::__cxx11::string>::
              Equals<std::__cxx11::string,std::__cxx11::string>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)it_local);
      if (bVar1) {
        Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::InnerMap::
        iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::iterator_base(&local_48,local_30,(InnerMap *)this,(size_type)node);
        std::
        make_pair<google::protobuf::Map<std::__cxx11::string,std::__cxx11::string>::InnerMap::iterator_base<google::protobuf::MapPair<std::__cxx11::string,std::__cxx11::string>const>,unsigned_long&>
                  (__return_storage_ptr__,&local_48,(unsigned_long *)&node);
        return __return_storage_ptr__;
      }
      local_30 = local_30->next;
    } while (local_30 != (Node *)0x0);
    local_30 = (Node *)0x0;
  }
  else {
    bVar1 = Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::InnerMap::TableEntryIsTree((InnerMap *)this,(size_type)node);
    if (bVar1) {
      local_81 = 0;
      if (*(long *)(*(long *)(this + 0x20) + (long)node * 8) !=
          *(long *)(*(long *)(this + 0x20) + ((ulong)node ^ 1) * 8)) {
        internal::LogMessage::LogMessage
                  (&local_80,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
                   ,0x314);
        local_81 = 1;
        other = internal::LogMessage::operator<<
                          (&local_80,"CHECK failed: (table_[b]) == (table_[b ^ 1]): ");
        internal::LogFinisher::operator=((LogFinisher *)((long)&tree + 3),other);
      }
      if ((local_81 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_80);
      }
      node = (Node *)((ulong)node & 0xfffffffffffffffe);
      tree_it._M_node = *(_Base_ptr *)(*(long *)(this + 0x20) + (long)node * 8);
      local_a8._M_node =
           (_Base_ptr)
           std::
           map<std::reference_wrapper<std::__cxx11::string_const>,void*,google::protobuf::internal::TransparentSupport<std::__cxx11::string>::less,google::protobuf::internal::MapAllocator<std::pair<std::reference_wrapper<std::__cxx11::string_const>const,void*>>>
           ::find<std::__cxx11::string>
                     (tree_it._M_node,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)it_local)
      ;
      local_b0._M_node =
           (_Base_ptr)
           std::
           map<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_*,_google::protobuf::internal::TransparentSupport<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::less,_google::protobuf::internal::MapAllocator<std::pair<const_std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_*>_>_>
           ::end(tree_it._M_node);
      bVar1 = std::operator!=(&local_a8,&local_b0);
      if (bVar1) {
        if (b != 0) {
          *(_Base_ptr *)b = local_a8._M_node;
        }
        local_d0 = local_a8._M_node;
        Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::InnerMap::
        iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::iterator_base(&local_c8,(TreeIterator)local_a8._M_node,(InnerMap *)this,(size_type)node);
        std::
        make_pair<google::protobuf::Map<std::__cxx11::string,std::__cxx11::string>::InnerMap::iterator_base<google::protobuf::MapPair<std::__cxx11::string,std::__cxx11::string>const>,unsigned_long&>
                  (__return_storage_ptr__,&local_c8,(unsigned_long *)&node);
        return __return_storage_ptr__;
      }
    }
  }
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::InnerMap::end(&local_e8,(InnerMap *)this);
  std::
  make_pair<google::protobuf::Map<std::__cxx11::string,std::__cxx11::string>::InnerMap::iterator_base<google::protobuf::MapPair<std::__cxx11::string,std::__cxx11::string>const>,unsigned_long&>
            (__return_storage_ptr__,&local_e8,(unsigned_long *)&node);
  return __return_storage_ptr__;
}

Assistant:

std::pair<const_iterator, size_type> FindHelper(const K& k,
                                                    TreeIterator* it) const {
      size_type b = BucketNumber(k);
      if (TableEntryIsNonEmptyList(b)) {
        Node* node = static_cast<Node*>(table_[b]);
        do {
          if (internal::TransparentSupport<Key>::Equals(node->kv.first, k)) {
            return std::make_pair(const_iterator(node, this, b), b);
          } else {
            node = node->next;
          }
        } while (node != nullptr);
      } else if (TableEntryIsTree(b)) {
        GOOGLE_DCHECK_EQ(table_[b], table_[b ^ 1]);
        b &= ~static_cast<size_t>(1);
        Tree* tree = static_cast<Tree*>(table_[b]);
        auto tree_it = tree->find(k);
        if (tree_it != tree->end()) {
          if (it != nullptr) *it = tree_it;
          return std::make_pair(const_iterator(tree_it, this, b), b);
        }
      }
      return std::make_pair(end(), b);
    }